

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlEnumerationPtr xmlCopyEnumeration(xmlEnumerationPtr cur)

{
  xmlEnumerationPtr pxVar1;
  xmlEnumerationPtr pxVar2;
  xmlEnumerationPtr copy;
  xmlEnumerationPtr last;
  xmlEnumerationPtr ret;
  xmlEnumerationPtr cur_local;
  
  last = (xmlEnumerationPtr)0x0;
  copy = (xmlEnumerationPtr)0x0;
  ret = cur;
  while( true ) {
    if (ret == (xmlEnumerationPtr)0x0) {
      return last;
    }
    pxVar2 = xmlCreateEnumeration(ret->name);
    if (pxVar2 == (xmlEnumerationPtr)0x0) break;
    pxVar1 = pxVar2;
    if (last != (xmlEnumerationPtr)0x0) {
      copy->next = pxVar2;
      pxVar1 = last;
    }
    last = pxVar1;
    ret = ret->next;
    copy = pxVar2;
  }
  xmlFreeEnumeration(last);
  return (xmlEnumerationPtr)0x0;
}

Assistant:

xmlEnumerationPtr
xmlCopyEnumeration(xmlEnumerationPtr cur) {
    xmlEnumerationPtr ret = NULL;
    xmlEnumerationPtr last = NULL;

    while (cur != NULL) {
        xmlEnumerationPtr copy = xmlCreateEnumeration(cur->name);

        if (copy == NULL) {
            xmlFreeEnumeration(ret);
            return(NULL);
        }

        if (ret == NULL) {
            ret = last = copy;
        } else {
            last->next = copy;
            last = copy;
        }

        cur = cur->next;
    }

    return(ret);
}